

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

int __thiscall leveldb::DBTest::NumTableFilesAtLevel(DBTest *this,int level)

{
  DB *pDVar1;
  char *__nptr;
  int iVar2;
  long *plVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  long *plVar7;
  uint64_t num;
  string property;
  long *local_240;
  long local_230;
  undefined4 uStack_228;
  undefined4 uStack_224;
  char *local_220;
  undefined8 local_218;
  char local_210 [16];
  string local_200;
  long *local_1e0;
  long local_1d8;
  Tester local_1d0;
  
  local_218 = 0;
  local_210[0] = '\0';
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x196;
  local_220 = local_210;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pDVar1 = this->db_;
  NumberToString_abi_cxx11_(&local_200,(leveldb *)(long)level,num);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x141f1c);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_230 = *plVar7;
    uStack_228 = (undefined4)plVar3[3];
    uStack_224 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_240 = &local_230;
  }
  else {
    local_230 = *plVar7;
    local_240 = (long *)*plVar3;
  }
  local_1d8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1e0 = local_240;
  iVar2 = (*pDVar1->_vptr_DB[9])(pDVar1,&local_1e0,&local_220);
  test::Tester::Is(&local_1d0,SUB41(iVar2,0),
                   "db_->GetProperty( \"leveldb.num-files-at-level\" + NumberToString(level), &property)"
                  );
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  __nptr = local_220;
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(__nptr,(char **)&local_1d0,10);
  if ((char *)CONCAT71(local_1d0._1_7_,local_1d0.ok_) == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar5 == lVar5) && (*piVar4 != 0x22)) {
    if (*piVar4 == 0) {
      *piVar4 = iVar2;
    }
    if (local_220 != local_210) {
      operator_delete(local_220);
    }
    return (int)lVar5;
  }
  uVar6 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int NumTableFilesAtLevel(int level) {
    std::string property;
    ASSERT_TRUE(db_->GetProperty(
        "leveldb.num-files-at-level" + NumberToString(level), &property));
    return std::stoi(property);
  }